

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeFabricEdgeGetVerticesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_vertex_handle_t *phVertexA,
          ze_fabric_vertex_handle_t *phVertexB)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ze_result_t zVar7;
  ze_result_t result;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_9c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = context;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeFabricEdgeGetVerticesExp(hEdge, phVertexA, phVertexB)","");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar6 + 0x650);
  if (pcVar3 == (code *)0x0) {
    zVar7 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar6 + 0xd30);
    lVar4 = *(long *)(lVar6 + 0xd38);
    uVar8 = lVar4 - lVar2 >> 3;
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar9 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(lVar6 + 0xd30) + -8 + uVar9 * 8);
        zVar7 = (**(code **)(*plVar5 + 0xb50))(plVar5,hEdge,phVertexA,phVertexB);
        if (zVar7 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeFabricEdgeGetVerticesExp",zVar7);
          local_9c = zVar7;
          break;
        }
        bVar10 = uVar9 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar9;
        uVar9 = uVar9 + 1;
      } while (lVar1 != 0);
    }
    if (bVar10) {
      return local_9c;
    }
    if ((*(char *)(lVar6 + 4) == '\x01') &&
       (zVar7 = ZEHandleLifetimeValidation::zeFabricEdgeGetVerticesExpPrologue
                          (*(ZEHandleLifetimeValidation **)(lVar6 + 0xd48),hEdge,phVertexA,phVertexB
                          ), zVar7 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeFabricEdgeGetVerticesExp",zVar7);
      return zVar7;
    }
    zVar7 = (*pcVar3)(hEdge,phVertexA,phVertexB);
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar9 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar9 * 8);
        result = (**(code **)(*plVar5 + 0xb58))(plVar5,hEdge,phVertexA,phVertexB,zVar7);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeFabricEdgeGetVerticesExp",result);
          local_9c = result;
          break;
        }
        bVar10 = uVar9 < uVar8;
        lVar2 = (-(ulong)(uVar8 == 0) - uVar8) + uVar9;
        uVar9 = uVar9 + 1;
      } while (lVar2 != 0);
    }
    lVar2 = context;
    if (bVar10) {
      return local_9c;
    }
    if ((zVar7 == ZE_RESULT_SUCCESS) && (*(char *)(context + 4) == '\x01')) {
      if (phVertexA != (ze_fabric_vertex_handle_t *)0x0) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(context + 0xd48),*phVertexA);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar2 + 0xd48),hEdge,*phVertexA);
      }
      if (phVertexB != (ze_fabric_vertex_handle_t *)0x0) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(lVar2 + 0xd48),*phVertexB);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar2 + 0xd48),hEdge,*phVertexB);
      }
    }
  }
  logAndPropagateResult("zeFabricEdgeGetVerticesExp",zVar7);
  return zVar7;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetVerticesExp(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge instance
        ze_fabric_vertex_handle_t* phVertexA,           ///< [out] fabric vertex connected to one end of the given fabric edge.
        ze_fabric_vertex_handle_t* phVertexB            ///< [out] fabric vertex connected to other end of the given fabric edge.
        )
    {
        context.logger->log_trace("zeFabricEdgeGetVerticesExp(hEdge, phVertexA, phVertexB)");

        auto pfnGetVerticesExp = context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp;

        if( nullptr == pfnGetVerticesExp )
            return logAndPropagateResult("zeFabricEdgeGetVerticesExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeFabricEdgeGetVerticesExpPrologue( hEdge, phVertexA, phVertexB );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeFabricEdgeGetVerticesExpPrologue( hEdge, phVertexA, phVertexB );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }

        auto driver_result = pfnGetVerticesExp( hEdge, phVertexA, phVertexB );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeFabricEdgeGetVerticesExpEpilogue( hEdge, phVertexA, phVertexB ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phVertexA){
                context.handleLifetime->addHandle( *phVertexA );
                context.handleLifetime->addDependent( hEdge, *phVertexA );

            }
            if (phVertexB){
                context.handleLifetime->addHandle( *phVertexB );
                context.handleLifetime->addDependent( hEdge, *phVertexB );

            }
        }
        return logAndPropagateResult("zeFabricEdgeGetVerticesExp", driver_result);
    }